

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimedExecution.h
# Opt level: O2

void nrg::TimedExecution::push<void(*)(int,std::__cxx11::string_const&),int&,char_const(&)[7]>
               (Queue *queue,
               _func_void_int_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
               *fn,int *param,char (*param_4) [7])

{
  QueueElement elem;
  QueueElement local_90;
  QueueElement local_68;
  anon_class_24_3_7e084ec6 local_40;
  
  local_68.when.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_40.param = *param;
  local_40._12_3_ = SUB43(*(undefined4 *)*param_4,0);
  local_40._15_1_ = SUB41(*(undefined4 *)(*param_4 + 3),0);
  local_40._16_3_ = SUB43((uint)*(undefined4 *)(*param_4 + 3) >> 8,0);
  local_40.fn = fn;
  std::function<void()>::
  function<nrg::TimedExecution::push<void(*)(int,std::__cxx11::string_const&),int&,char_const(&)[7]>(std::priority_queue<nrg::TimedExecution::QueueElement,std::vector<nrg::TimedExecution::QueueElement,std::allocator<nrg::TimedExecution::QueueElement>>,std::greater<nrg::TimedExecution::QueueElement>>&,void(*)(int,std::__cxx11::string_const&),int&,char_const(&)[7])::_lambda()_1_,void>
            ((function<void()> *)&local_68.what,&local_40);
  QueueElement::QueueElement(&local_90,&local_68);
  std::
  priority_queue<nrg::TimedExecution::QueueElement,_std::vector<nrg::TimedExecution::QueueElement,_std::allocator<nrg::TimedExecution::QueueElement>_>,_std::greater<nrg::TimedExecution::QueueElement>_>
  ::push(queue,&local_90);
  std::_Function_base::~_Function_base(&local_90.what.super__Function_base);
  std::_Function_base::~_Function_base(&local_68.what.super__Function_base);
  return;
}

Assistant:

static void push(Queue& queue, FN fn, Param&&... param)
    {
        QueueElement elem = { now(), [=]() { fn(param...); } };
        push(queue, std::move(elem));
    }